

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satVec.h
# Opt level: O2

int Int_ManEnqueue(Int_Man_t *p,lit Lit,Sto_Cls_t *pReason)

{
  int iVar1;
  int iVar2;
  
  iVar2 = Lit >> 1;
  iVar1 = p->pAssigns[iVar2];
  if (iVar1 != -1) {
    return (int)(iVar1 == Lit);
  }
  p->pAssigns[iVar2] = Lit;
  p->pReasons[iVar2] = pReason;
  iVar1 = p->nTrailSize;
  p->nTrailSize = iVar1 + 1;
  p->pTrail[iVar1] = Lit;
  return 1;
}

Assistant:

static inline int  lit_var  (lit l)        { return l >> 1; }